

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.h
# Opt level: O2

bool __thiscall IceMaths::AABB::IsInside(AABB *this,AABB *box)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar1 = (box->mCenter).x;
  fVar2 = (box->mExtents).x;
  fVar3 = (this->mCenter).x;
  fVar4 = (this->mExtents).x;
  if (fVar1 - fVar2 <= fVar3 - fVar4) {
    fVar5 = (box->mCenter).y;
    fVar6 = (box->mExtents).y;
    fVar7 = (this->mCenter).y;
    fVar8 = (this->mExtents).y;
    if (fVar5 - fVar6 <= fVar7 - fVar8) {
      fVar9 = (box->mCenter).z;
      fVar10 = (box->mExtents).z;
      fVar11 = (this->mCenter).z;
      fVar12 = (this->mExtents).z;
      if (((fVar9 - fVar10 <= fVar11 - fVar12) && (fVar3 + fVar4 <= fVar1 + fVar2)) &&
         (fVar7 + fVar8 <= fVar5 + fVar6)) {
        return fVar11 + fVar12 <= fVar9 + fVar10;
      }
    }
  }
  return false;
}

Assistant:

inline_			float		GetMin(udword axis)						const		{ return mCenter[axis] - mExtents[axis];	}